

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void save_predictor(vw *all,string *reg_name,size_t current_pass)

{
  ostream *this;
  ulong in_RDX;
  string *in_RSI;
  long in_RDI;
  stringstream filename;
  bool in_stack_00000137;
  string *in_stack_00000138;
  vw *in_stack_00000140;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190;
  ulong local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,in_RSI);
  if ((*(byte *)(local_8 + 0x90) & 1) != 0) {
    this = std::operator<<(&local_190,".");
    std::ostream::operator<<(this,local_18);
  }
  std::__cxx11::stringstream::str();
  dump_regressor(in_stack_00000140,in_stack_00000138,in_stack_00000137);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void save_predictor(vw& all, string reg_name, size_t current_pass)
{
  stringstream filename;
  filename << reg_name;
  if (all.save_per_pass)
    filename << "." << current_pass;
  dump_regressor(all, filename.str(), false);
}